

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs *bs,ma_dr_flac_subframe *pSubframe)

{
  ulong uVar1;
  byte bVar2;
  ma_bool32 mVar3;
  ma_bool32 mVar4;
  undefined8 in_RAX;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  ma_uint8 header;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  mVar3 = ma_dr_flac__read_uint8(bs,8,&local_21);
  mVar4 = 0;
  if ((-1 < (char)local_21 & (byte)mVar3) == 1) {
    pSubframe->lpcOrder = '\0';
    bVar2 = local_21 >> 1;
    if (bVar2 == 1) {
      pSubframe->subframeType = '\x01';
    }
    else if (bVar2 == 0) {
      pSubframe->subframeType = '\0';
    }
    else if (local_21 < 0x40) {
      if ((local_21 & 0x10) == 0) {
        pSubframe->subframeType = 0xff;
      }
      else {
        pSubframe->subframeType = '\b';
        pSubframe->lpcOrder = bVar2 & 7;
        if (4 < (bVar2 & 7)) {
          pSubframe->subframeType = 0xff;
          pSubframe->lpcOrder = '\0';
        }
      }
    }
    else {
      pSubframe->subframeType = ' ';
      pSubframe->lpcOrder = (bVar2 & 0x1f) + 1;
    }
    if (pSubframe->subframeType != 0xff) {
      pSubframe->wastedBitsPerSample = '\0';
      mVar4 = 1;
      if ((local_21 & 1) != 0) {
        iVar7 = 0;
        do {
          cVar6 = (char)iVar7;
          uVar1 = bs->cache;
          if (uVar1 != 0) {
            if (uVar1 == 1) {
              cVar6 = (cVar6 - (char)bs->consumedBits) + '?';
              mVar3 = ma_dr_flac__reload_cache(bs);
              bVar10 = mVar3 == 0;
              goto LAB_00169106;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar1 == 0) {
                iVar7 = 0x40;
              }
              else {
                if (uVar1 >> 0x3c == 0) {
                  bVar10 = uVar1 >> 0x20 == 0;
                  uVar8 = uVar1 << 0x20;
                  if (!bVar10) {
                    uVar8 = uVar1;
                  }
                  iVar9 = (uint)bVar10 * 0x20;
                  iVar7 = iVar9 + 0x10;
                  uVar1 = uVar8 << 0x10;
                  if (uVar8 >> 0x30 != 0) {
                    iVar7 = iVar9;
                    uVar1 = uVar8;
                  }
                  iVar9 = iVar7 + 8;
                  uVar8 = uVar1 << 8;
                  if (uVar1 >> 0x38 != 0) {
                    iVar9 = iVar7;
                    uVar8 = uVar1;
                  }
                  iVar7 = iVar9 + 4;
                  uVar1 = uVar8 << 4;
                  if (0xfffffffffffffff < uVar8) {
                    iVar7 = iVar9;
                    uVar1 = uVar8;
                  }
                  iVar7 = iVar7 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar1 >> 0x3c) * 4);
                }
                else {
                  iVar7 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (uVar1 >> 0x3c) * 4);
                }
                iVar7 = iVar7 + -1;
              }
            }
            else {
              iVar7 = (int)LZCOUNT(uVar1);
            }
            uVar5 = iVar7 + 1;
            if ((ulong)uVar5 <= 0x40 - (ulong)bs->consumedBits) {
              bs->consumedBits = bs->consumedBits + uVar5;
              bs->cache = bs->cache << ((byte)uVar5 & 0x3f);
              cVar6 = (char)iVar7 + cVar6;
              bVar10 = false;
              goto LAB_00169106;
            }
            break;
          }
          iVar7 = (iVar7 - bs->consumedBits) + 0x40;
          cVar6 = (char)iVar7;
          mVar3 = ma_dr_flac__reload_cache(bs);
        } while (mVar3 != 0);
        bVar10 = true;
LAB_00169106:
        mVar4 = 0;
        if (!bVar10) {
          pSubframe->wastedBitsPerSample = cVar6 + '\x01';
          mVar4 = 1;
        }
      }
    }
  }
  return mVar4;
}

Assistant:

static ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs* bs, ma_dr_flac_subframe* pSubframe)
{
    ma_uint8 header;
    int type;
    if (!ma_dr_flac__read_uint8(bs, 8, &header)) {
        return MA_FALSE;
    }
    if ((header & 0x80) != 0) {
        return MA_FALSE;
    }
    pSubframe->lpcOrder = 0;
    type = (header & 0x7E) >> 1;
    if (type == 0) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_CONSTANT;
    } else if (type == 1) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_VERBATIM;
    } else {
        if ((type & 0x20) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_LPC;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x1F) + 1;
        } else if ((type & 0x08) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_FIXED;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x07);
            if (pSubframe->lpcOrder > 4) {
                pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
                pSubframe->lpcOrder = 0;
            }
        } else {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
        }
    }
    if (pSubframe->subframeType == MA_DR_FLAC_SUBFRAME_RESERVED) {
        return MA_FALSE;
    }
    pSubframe->wastedBitsPerSample = 0;
    if ((header & 0x01) == 1) {
        unsigned int wastedBitsPerSample;
        if (!ma_dr_flac__seek_past_next_set_bit(bs, &wastedBitsPerSample)) {
            return MA_FALSE;
        }
        pSubframe->wastedBitsPerSample = (ma_uint8)wastedBitsPerSample + 1;
    }
    return MA_TRUE;
}